

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdownhighlighter.cpp
# Opt level: O2

void balancePairs(QVector<Delimiter> *delims)

{
  Delimiter *pDVar1;
  reference pDVar2;
  uint uVar3;
  int i;
  int iVar4;
  long i_00;
  ulong i_01;
  
  i_00 = 0;
  do {
    if ((delims->d).size <= i_00) {
      return;
    }
    pDVar1 = (delims->d).ptr;
    if (pDVar1[i_00].close == true) {
      iVar4 = (int)i_00;
      for (uVar3 = ~pDVar1[i_00].jump + iVar4; -1 < (int)uVar3; uVar3 = uVar3 + ~pDVar1[i_01].jump)
      {
        i_01 = (ulong)uVar3;
        if ((((pDVar1[i_01].open == true) && (pDVar1[i_01].marker == pDVar1[i_00].marker)) &&
            (pDVar1[i_01].end < 0)) &&
           (((pDVar1[i_01].close == false && (pDVar1[i_00].open != true)) ||
            ((pDVar1[i_01].len == -1 ||
             ((pDVar1[i_00].len == -1 || ((pDVar1[i_00].len + pDVar1[i_01].len) % 3 != 0)))))))) {
          pDVar2 = QList<Delimiter>::operator[](delims,i_00);
          pDVar2->jump = iVar4 - uVar3;
          pDVar2 = QList<Delimiter>::operator[](delims,i_00);
          pDVar2->open = false;
          pDVar2 = QList<Delimiter>::operator[](delims,i_01);
          pDVar2->end = iVar4;
          pDVar2 = QList<Delimiter>::operator[](delims,i_01);
          pDVar2->jump = 0;
          break;
        }
      }
    }
    i_00 = i_00 + 1;
  } while( true );
}

Assistant:

void balancePairs(QVector<Delimiter> &delims) {
    for (int i = 0; i < delims.length(); ++i) {
        const auto &lastDelim = delims.at(i);

        if (!lastDelim.close) continue;

        int j = i - lastDelim.jump - 1;

        while (j >= 0) {
            const auto &curDelim = delims.at(j);
            if (curDelim.open && curDelim.marker == lastDelim.marker &&
                curDelim.end < 0) {
                const bool oddMatch = (curDelim.close || lastDelim.open) &&
                                      curDelim.len != -1 &&
                                      lastDelim.len != -1 &&
                                      (curDelim.len + lastDelim.len) % 3 == 0;
                if (!oddMatch) {
                    delims[i].jump = i - j;
                    delims[i].open = false;
                    delims[j].end = i;
                    delims[j].jump = 0;
                    break;
                }
            }
            j -= curDelim.jump + 1;
        }
    }
}